

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ypspur-interpreter.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  size_t sVar8;
  undefined1 local_210 [8];
  double th;
  double y;
  double x;
  char text [16];
  char *p;
  undefined1 local_1d8 [4];
  int opt;
  option options [9];
  int local_ac;
  int msqid;
  int set_angaccel;
  int set_angvel;
  int set_accel;
  int set_vel;
  double angaccel;
  double accel;
  double angvel;
  double vel;
  int err;
  int active;
  int port;
  char ip [64];
  int local_1c;
  char **ppcStack_18;
  int coordinate;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_1c = 4;
  err = 0;
  bVar5 = true;
  bVar6 = false;
  angvel = 0.0;
  accel = 0.0;
  angaccel = 0.0;
  _set_accel = 0.0;
  bVar1 = false;
  bVar3 = false;
  bVar2 = false;
  bVar4 = false;
  local_ac = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  memcpy(local_1d8,&PTR_anon_var_dwarf_242_00107c90,0x120);
  hook_pre_global();
  while (iVar7 = getopt_long((int)argv_local,ppcStack_18,"V:W:A:O:c:q:s:h",local_1d8,0), iVar7 != -1
        ) {
    if (iVar7 - 0x41U < 0x32 || iVar7 == 0x73) {
      switch((long)&switchD_00103288::switchdataD_001040e4 +
             (long)(int)(&switchD_00103288::switchdataD_001040e4)[iVar7 - 0x41U]) {
      case 0x10328a:
        angvel = atof(_optarg);
        bVar1 = true;
        break;
      case 0x1032ad:
        accel = atof(_optarg);
        bVar2 = true;
        break;
      case 0x1032d0:
        angaccel = atof(_optarg);
        bVar3 = true;
        break;
      case 0x1032f6:
        _set_accel = atof(_optarg);
        bVar4 = true;
        break;
      case 0x10331c:
        if (local_ac == -1) {
          YPSpur_init_socket(&active,err);
        }
        else if (local_ac == 0) {
          YPSpur_init();
        }
        else {
          YPSpur_initex(local_ac);
        }
        proc_spur(_optarg,&local_1c);
        return 1;
      case 0x10336f:
        local_ac = atoi(_optarg);
        break;
      case 0x103389:
        strncpy((char *)&active,_optarg,0x40);
        text._8_8_ = strchr((char *)&active,0x3a);
        if ((char *)text._8_8_ == (char *)0x0) {
          fprintf(_stderr,"USAGE: %s -s ip:port\n",*ppcStack_18);
          return -1;
        }
        *(char *)text._8_8_ = '\0';
        err = atoi((char *)(text._8_8_ + 1));
        local_ac = -1;
        break;
      case 0x103414:
        print_help(ppcStack_18);
        return 1;
      case 0x103429:
        goto switchD_00103288_caseD_103429;
      }
    }
    else {
switchD_00103288_caseD_103429:
    }
  }
  signal(2,ctrlc);
  if (local_ac == -1) {
    YPSpur_init_socket(&active,err);
  }
  else if (local_ac == 0) {
    YPSpur_init();
  }
  else {
    YPSpur_initex(local_ac);
  }
  if (bVar1) {
    YPSpur_set_vel(angvel);
  }
  if (bVar2) {
    YPSpur_set_angvel(accel);
  }
  if (bVar3) {
    YPSpur_set_accel(angaccel);
  }
  if (bVar4) {
    YPSpur_set_angaccel(_set_accel);
  }
  using_history();
  read_history(".spurip_history");
  while (bVar5) {
    iVar7 = __sigsetjmp(ctrlc_capture,1);
    if (iVar7 == 0) {
      YPSpur_get_pos(2,&y,&th,local_210);
      iVar7 = YP_get_error_state();
      if (iVar7 == 0) {
        if (bVar6) {
          fprintf(_stderr,"INFO: YPSpur-coordinator started.\n");
          fflush(_stderr);
          signal(2,ctrlc);
        }
        bVar6 = false;
        snprintf((char *)&x,0x10,"%s> ",YPSpur_CSName + local_1c);
        main::line_prev = main::line;
        main::line = (char *)readline(&x);
        if (main::line == (char *)0x0) break;
        sVar8 = strlen(main::line);
        if (sVar8 != 0) {
          if ((main::line == (char *)0x0) || (main::line_prev == (char *)0x0)) {
            add_history(main::line);
          }
          else {
            iVar7 = strcmp(main::line,main::line_prev);
            if (iVar7 != 0) {
              add_history(main::line);
            }
          }
        }
        iVar7 = proc_spur(main::line,&local_1c);
        if (iVar7 < 0) {
          bVar5 = false;
        }
        if (main::line_prev != (char *)0x0) {
          free(main::line_prev);
        }
      }
      else {
        if (local_ac == -1) {
          YPSpur_init_socket(&active,err);
        }
        else if (local_ac == 0) {
          YPSpur_init();
        }
        else {
          YPSpur_initex(local_ac);
        }
        if (bVar1) {
          YPSpur_set_vel(angvel);
        }
        if (bVar2) {
          YPSpur_set_angvel(accel);
        }
        if (bVar3) {
          YPSpur_set_accel(angaccel);
        }
        if (bVar4) {
          YPSpur_set_angaccel(_set_accel);
        }
        if (!bVar6) {
          fprintf(_stderr,"WARN: YPSpur-coordinator terminated.\n");
          fflush(_stderr);
          signal(2,(__sighandler_t)0x0);
        }
        bVar6 = true;
        yp_usleep(50000);
      }
    }
    else {
      write_history(".spurip_history");
    }
  }
  printf("\n");
  write_history(".spurip_history");
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
  int coordinate = CS_FS;
  char ip[64];
  int port = 0;
  int active = 1;
  int err = 0;
  double vel = 0;
  double angvel = 0;
  double accel = 0;
  double angaccel = 0;
  int set_vel = 0;
  int set_accel = 0;
  int set_angvel = 0;
  int set_angaccel = 0;
  int msqid = 0;
  struct option options[9] =
      {
          {"set-vel", 1, 0, 'V'},
          {"set-angvel", 1, 0, 'W'},
          {"set-accel", 1, 0, 'A'},
          {"set-angaccel", 1, 0, 'O'},
          {"command", 1, 0, 'c'},
          {"msq-id", 1, 0, 'q'},
          {"socket", 1, 0, 's'},
          {"help", 0, 0, 'h'},
          {0, 0, 0, 0}};
  int opt;

  hook_pre_global();

  while ((opt = getopt_long(argc, argv, "V:W:A:O:c:q:s:h", options, NULL)) != -1)
  {
    switch (opt)
    {
      case 'V':
        vel = atof(optarg);
        set_vel = 1;
        break;
      case 'W':
        angvel = atof(optarg);
        set_angvel = 1;
        break;
      case 'A':
        accel = atof(optarg);
        set_accel = 1;
        break;
      case 'O':
        angaccel = atof(optarg);
        set_angaccel = 1;
        break;
      case 'c':
        if (msqid == -1)
          YPSpur_init_socket(ip, port);
        else if (msqid == 0)
          YPSpur_init();
        else
          YPSpur_initex(msqid);
        proc_spur(optarg, &coordinate);
        return 1;
        break;
      case 'q':
        msqid = atoi(optarg);
        break;
      case 's':
        strncpy(ip, optarg, 64);
        {
          char* p;
          p = strchr(ip, ':');
          if (p == NULL)
          {
            fprintf(stderr, "USAGE: %s -s ip:port\n", argv[0]);
            return -1;
          }
          *p = 0;
          port = atoi(p + 1);
          msqid = -1;
        }
        break;
      case 'h':
        print_help(argv);
        return 1;
        break;
      default:
        break;
    }
  }

#if HAVE_SIGLONGJMP
  signal(SIGINT, ctrlc);
#endif  // HAVE_SIGLONGJMP

  if (msqid == -1)
    YPSpur_init_socket(ip, port);
  else if (msqid == 0)
    YPSpur_init();
  else
    YPSpur_initex(msqid);

  if (set_vel)
    YPSpur_set_vel(vel);
  if (set_angvel)
    YPSpur_set_angvel(angvel);
  if (set_accel)
    YPSpur_set_accel(accel);
  if (set_angaccel)
    YPSpur_set_angaccel(angaccel);

#if HAVE_LIBREADLINE
  using_history();
  read_history(".spurip_history");
#endif  // HAVE_LIBREADLINE
  while (active)
  {
    static char* line = NULL;
    static char* line_prev = NULL;
    char text[16];
#if !HAVE_LIBREADLINE
#if HAVE_GETLINE
    size_t len;
#endif  // HAVE_GETLINE
#endif  // !HAVE_LIBREADLINE
#if HAVE_SIGLONGJMP
    if (sigsetjmp(ctrlc_capture, 1) != 0)
    {
#if HAVE_LIBREADLINE
      write_history(".spurip_history");
#endif  // HAVE_LIBREADLINE
    }
    else
#endif  // HAVE_SIGLONGJMP
    {
      {
        // Dummy for error checking
        double x, y, th;
        YPSpur_get_pos(CS_GL, &x, &y, &th);
      }
      if (YP_get_error_state())
      {
        if (msqid == -1)
          YPSpur_init_socket(ip, port);
        else if (msqid == 0)
          YPSpur_init();
        else
          YPSpur_initex(msqid);
        if (set_vel)
          YPSpur_set_vel(vel);
        if (set_angvel)
          YPSpur_set_angvel(angvel);
        if (set_accel)
          YPSpur_set_accel(accel);
        if (set_angaccel)
          YPSpur_set_angaccel(angaccel);
        if (err == 0)
        {
          fprintf(stderr, "WARN: YPSpur-coordinator terminated.\n");
          fflush(stderr);
#if HAVE_SIGLONGJMP
          signal(SIGINT, NULL);
#endif  // HAVE_SIGLONGJMP
        }
        err = 1;
        yp_usleep(50000);
        continue;
      }
      else
      {
        if (err == 1)
        {
          fprintf(stderr, "INFO: YPSpur-coordinator started.\n");
          fflush(stderr);
#if HAVE_SIGLONGJMP
          signal(SIGINT, ctrlc);
#endif  // HAVE_SIGLONGJMP
        }
      }
      err = 0;

      snprintf(text, sizeof(text), "%s> ", YPSpur_CSName[coordinate]);
#if HAVE_LIBREADLINE
      line_prev = line;
      line = readline(text);
      if (!line)
      {
        // EOF
        break;
      }
      if (strlen(line) > 0)
      {
        if (line && line_prev)
        {
          if (strcmp(line, line_prev) != 0)
          {
            add_history(line);
          }
        }
        else
        {
          add_history(line);
        }
      }
#else
      printf("%s", text);
      fflush(stdout);
      line = NULL;
#if HAVE_GETLINE
      len = 0;
      getline(&line, &len, stdin);
      if (len == 0)
        continue;
#else
      line = malloc(512);
      fgets(line, 512, stdin);
#endif  // HAVE_GETLINE
      line_prev = line;
#endif  // HAVE_LIBREADLINE
      if (proc_spur(line, &coordinate) < 0)
      {
        active = 0;
      }

      if (line_prev)
        free(line_prev);
    }
  }
  printf("\n");
#if HAVE_LIBREADLINE
  write_history(".spurip_history");
#endif  // HAVE_LIBREADLINE

  return 0;
}